

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

int32 Js::JavascriptOperators::OP_GetNativeIntElementI_Int32
                (Var instance,int32 index,ScriptContext *scriptContext)

{
  int32 iVar1;
  
  iVar1 = OP_GetNativeIntElementI(instance,(Var)((ulong)(uint)index | 0x1000000000000));
  return iVar1;
}

Assistant:

int32 JavascriptOperators::OP_GetNativeIntElementI_Int32(Var instance, int32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_GetNativeIntElementI_Int32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_GetNativeIntElementI_Int32, Op_GetNativeIntElementI);
#if FLOATVAR
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVar(index, scriptContext));
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer));
#endif
        JIT_HELPER_END(Op_GetNativeIntElementI_Int32);
    }